

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-readable-on-eof.c
# Opt level: O1

void read_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  void *local_18;
  
  if (tcp != (uv_stream_t *)0x0) {
    if (nread < 0) {
      local_18 = (void *)nread;
      if (nread != -0xfff) goto LAB_001ce341;
      puts("GOT EOF");
      uv_close((uv_handle_t *)tcp,close_cb);
    }
    else {
      bytes_received_done = bytes_received_done + nread;
    }
    free(buf->base);
    return;
  }
  read_cb_cold_2();
LAB_001ce341:
  handle = (uv_handle_t *)&stack0xffffffffffffffe8;
  read_cb_cold_1();
  if (handle != (uv_handle_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void read_cb(uv_stream_t* handle, ssize_t nread, const uv_buf_t* buf) {
  int r;

  ASSERT_EQ(nread, UV_EOF);
  ASSERT_EQ(1, uv_is_readable(handle));
  ASSERT_EQ(1, uv_is_writable(handle));

  if (++read_cb_called == 3) {
      uv_close((uv_handle_t*) handle, close_cb);
      ASSERT_OK(uv_is_readable(handle));
      ASSERT_OK(uv_is_writable(handle));
  } else {
      r = uv_read_start((uv_stream_t*) &tcp_client, alloc_cb, read_cb);
      ASSERT_OK(r);
  }
}